

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounds.c
# Opt level: O0

int dotalk(void)

{
  boolean bVar1;
  int iVar2;
  boolean save_soundok;
  int result;
  
  bVar1 = flags.soundok;
  flags.soundok = '\x01';
  iVar2 = dochat();
  flags.soundok = bVar1;
  return iVar2;
}

Assistant:

int dotalk(void)
{
    int result;
    boolean save_soundok = flags.soundok;
    flags.soundok = 1;	/* always allow sounds while chatting */
    result = dochat();
    flags.soundok = save_soundok;
    return result;
}